

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O2

void __thiscall playableWorld::shoot(playableWorld *this)

{
  bool bVar1;
  pair<int,_int> wumpus_location;
  
  wumpus_location = World::get_wumpus_location(&this->world);
  if (0 < this->arrow) {
    bVar1 = is_wumpus_in_line_sight(this,wumpus_location);
    if (bVar1) {
      World::remove_wumpus(&this->world);
    }
    this->arrow = this->arrow + -1;
  }
  return;
}

Assistant:

void playableWorld::shoot( ){
  pair<int, int> wumpus_location = world.get_wumpus_location();
 // bool has_arrow = play_Ground::arrow=1;
  if(arrow>0){
    if(is_wumpus_in_line_sight(wumpus_location)){
      world.remove_wumpus(); 
    }
   arrow--;
  }
}